

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

size_t jessilib::array_start_action<char32_t,jessilib::json_context<char32_t,true>>
                 (json_context<char32_t,_true> *inout_context,
                 basic_string_view<char32_t,_std::char_traits<char32_t>_> *inout_read_view)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  invalid_argument *piVar4;
  basic_string_view<char32_t,_std::char_traits<char32_t>_> *args_1;
  vector<jessilib::object,_std::allocator<jessilib::object>_> result;
  object obj;
  string local_58;
  undefined8 local_38;
  char8_t *local_30;
  
  result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<jessilib::object,_std::allocator<jessilib::object>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  advance_whitespace<char32_t>(inout_read_view);
  if (inout_read_view->_M_len == 0) {
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,
               "Invalid JSON data: unexpected end of data when parsing object array; expected \']\'"
              );
  }
  else {
    if (*inout_read_view->_M_str == L']') {
      inout_read_view->_M_str = inout_read_view->_M_str + 1;
      inout_read_view->_M_len = inout_read_view->_M_len - 1;
      std::
      variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
      ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
                ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                  *)inout_context->out_object,&result);
LAB_001b8ac2:
      std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector(&result);
      return 1;
    }
    do {
      obj.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_u._M_first._M_storage = (_Uninitialized<void_*,_true>)(void *)0x0;
      obj.m_value.
      super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      .
      super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      .
      super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
      ._M_index = '\0';
      bVar3 = deserialize_json<char32_t,_true,_&jessilib::fail_action>(&obj,inout_read_view);
      if (!bVar3) {
LAB_001b8add:
        std::__detail::__variant::
        _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                             *)&obj);
        break;
      }
      std::vector<jessilib::object,_std::allocator<jessilib::object>_>::
      emplace_back<jessilib::object>(&result,&obj);
      advance_whitespace<char32_t>(inout_read_view);
      sVar2 = inout_read_view->_M_len;
      if (sVar2 == 0) goto LAB_001b8add;
      args_1 = (basic_string_view<char32_t,_std::char_traits<char32_t>_> *)inout_read_view->_M_str;
      iVar1 = (int)args_1->_M_len;
      if (iVar1 != 0x2c) {
        if (iVar1 != 0x5d) {
          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
          local_38 = 0x3d;
          local_30 = "Invalid JSON data: expected \',\' or \']\', instead encountered: ";
          join_mbstring<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char32_t,std::char_traits<char32_t>>&>
                    (&local_58,(jessilib *)&local_38,
                     (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)inout_read_view,
                     args_1);
          std::invalid_argument::invalid_argument(piVar4,(string *)&local_58);
          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        inout_read_view->_M_str = (char32_t *)((long)&args_1->_M_len + 4);
        inout_read_view->_M_len = sVar2 - 1;
        std::
        variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
        ::emplace<6ul,std::vector<jessilib::object,std::allocator<jessilib::object>>>
                  ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
                    *)inout_context->out_object,&result);
        std::__detail::__variant::
        _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
        ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                             *)&obj);
        goto LAB_001b8ac2;
      }
      inout_read_view->_M_str = (char32_t *)((long)&args_1->_M_len + 4);
      inout_read_view->_M_len = sVar2 - 1;
      advance_whitespace<char32_t>(inout_read_view);
      std::__detail::__variant::
      _Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
      ::~_Variant_storage((_Variant_storage<false,_void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
                           *)&obj);
    } while (inout_read_view->_M_len != 0);
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar4,
               "Invalid JSON data: unexpected end of data when parsing object array; expected \']\'"
              );
  }
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

size_t array_start_action(ContextT& inout_context, std::basic_string_view<CharT>& inout_read_view) {
	std::vector<object> result;

	advance_whitespace(inout_read_view);
	if (inout_read_view.empty()) {
		if constexpr (ContextT::use_exceptions) {
			throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected ']'" };
		}

		return std::numeric_limits<size_t>::max();
	}

	// Checking here instead of top of loop means no trailing comma support.
	if (inout_read_view.front() == ']') {
		// End of array; success
		inout_read_view.remove_prefix(1);
		inout_context.out_object = std::move(result);
		return 1;
	}

	do {
		// Read object
		object obj;
		if (!deserialize_json<CharT, ContextT::use_exceptions>(obj, inout_read_view)) {
			// Invalid JSON! Any exception would've been thrown already
			break;
		}
		result.push_back(std::move(obj));

		advance_whitespace(inout_read_view);
		if (inout_read_view.empty()) {
			// Unexpected end of data; missing ']'; fail
			break;
		}

		CharT front = inout_read_view.front();
		if (front == ',') {
			// Strip comma
			inout_read_view.remove_prefix(1);
			advance_whitespace(inout_read_view);

			// Right now there's no trailing comma support; should behavior be a template option?
		}
		else if (front == ']') {
			// End of array; success
			inout_read_view.remove_prefix(1);
			inout_context.out_object = std::move(result);
			return 1;
		}
		else {
			// Invalid JSON!
			if constexpr (ContextT::use_exceptions) {
				using namespace std::literals;
				throw std::invalid_argument{ jessilib::join_mbstring(
					u8"Invalid JSON data: expected ',' or ']', instead encountered: "sv,
					inout_read_view) };
			}

			return std::numeric_limits<size_t>::max();
		}
	} while (!inout_read_view.empty());

	// Invalid JSON encountered
	if constexpr (ContextT::use_exceptions) {
		throw std::invalid_argument{ "Invalid JSON data: unexpected end of data when parsing object array; expected ']'" };
	}

	return std::numeric_limits<size_t>::max();
}